

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O0

void do_drag(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *in_RSI;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var4;
  char dir [4608];
  char target [4608];
  char store [4608];
  char *direction;
  CHAR_DATA *victim;
  EXIT_DATA *pexit;
  ROOM_INDEX_DATA *to_room;
  int skill;
  int where;
  CHAR_DATA *in_stack_ffffffffffffc9b8;
  CHAR_DATA *in_stack_ffffffffffffc9c0;
  undefined4 in_stack_ffffffffffffc9c8;
  int in_stack_ffffffffffffc9cc;
  CHAR_DATA *in_stack_ffffffffffffc9d0;
  undefined7 in_stack_ffffffffffffc9d8;
  undefined1 in_stack_ffffffffffffc9df;
  CHAR_DATA *in_stack_ffffffffffffc9e0;
  CHAR_DATA *in_stack_ffffffffffffc9e8;
  CHAR_DATA *in_stack_ffffffffffffc9f0;
  CHAR_DATA *in_stack_ffffffffffffca10;
  int in_stack_ffffffffffffca94;
  undefined1 in_stack_ffffffffffffca9b;
  int in_stack_ffffffffffffca9c;
  CHAR_DATA *in_stack_ffffffffffffcaa0;
  int in_stack_ffffffffffffcabc;
  CHAR_DATA *in_stack_ffffffffffffcac0;
  char *in_stack_ffffffffffffdbc0;
  char in_stack_ffffffffffffdbc8;
  undefined7 in_stack_ffffffffffffdbc9;
  undefined1 in_stack_ffffffffffffe0da;
  undefined1 in_stack_ffffffffffffe0db;
  int in_stack_ffffffffffffe0dc;
  CHAR_DATA *in_stack_ffffffffffffe0e0;
  CHAR_DATA local_1238 [5];
  char *local_38;
  CHAR_DATA *local_30;
  EXIT_DATA *local_28;
  anon_union_8_2_1bf22910_for_u1 local_20;
  int local_18;
  int local_14;
  char *local_10;
  CHAR_DATA *local_8;
  
  local_30 = (CHAR_DATA *)0x0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = get_skill(in_stack_ffffffffffffcac0,in_stack_ffffffffffffcabc);
  if (local_18 == 0) {
    send_to_char((char *)in_stack_ffffffffffffc9d0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
  }
  else if (*local_10 == '\0') {
    send_to_char((char *)in_stack_ffffffffffffc9d0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
  }
  else {
    local_10 = one_argument((char *)in_stack_ffffffffffffc9c0,(char *)in_stack_ffffffffffffc9b8);
    local_10 = one_argument((char *)in_stack_ffffffffffffc9c0,(char *)in_stack_ffffffffffffc9b8);
    if (in_stack_ffffffffffffdbc8 == '\0') {
      send_to_char((char *)in_stack_ffffffffffffc9d0,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
    }
    else if ((char)in_stack_ffffffffffffc9c8 == '\0') {
      send_to_char((char *)in_stack_ffffffffffffc9d0,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
    }
    else {
      local_30 = get_char_room((CHAR_DATA *)
                               CONCAT71(in_stack_ffffffffffffdbc9,in_stack_ffffffffffffdbc8),
                               in_stack_ffffffffffffdbc0);
      if (local_30 == (CHAR_DATA *)0x0) {
        send_to_char((char *)in_stack_ffffffffffffc9d0,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
      }
      else {
        bVar1 = is_safe_new(in_stack_ffffffffffffc9e8,in_stack_ffffffffffffc9e0,
                            (bool)in_stack_ffffffffffffc9df);
        if (!bVar1) {
          bVar1 = is_awake(local_30);
          if (bVar1) {
            send_to_char((char *)in_stack_ffffffffffffc9d0,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8))
            ;
          }
          else {
            bVar1 = is_npc(in_stack_ffffffffffffc9b8);
            if (bVar1) {
              in_stack_ffffffffffffc9c0 = (CHAR_DATA *)local_30->act[0];
              _Var4 = std::pow<int,int>(0,0x75decc);
              if (((ulong)in_stack_ffffffffffffc9c0 & (long)_Var4) != 0) {
                act((char *)in_stack_ffffffffffffc9d0,
                    (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8),
                    in_stack_ffffffffffffc9c0,in_stack_ffffffffffffc9b8,0);
                return;
              }
            }
            if ((local_8->size + 1 < (int)local_30->size) && (local_30 == local_8)) {
              send_to_char((char *)in_stack_ffffffffffffc9d0,
                           (CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
            }
            else if (local_8->fighting == (CHAR_DATA *)0x0) {
              local_14 = direction_lookup((char *)in_stack_ffffffffffffc9c0);
              if (local_14 == -1) {
                send_to_char((char *)in_stack_ffffffffffffc9d0,
                             (CHAR_DATA *)
                             CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
              }
              else {
                local_38 = flag_name_lookup(CONCAT44(in_stack_ffffffffffffc9cc,
                                                     in_stack_ffffffffffffc9c8),
                                            (flag_type *)in_stack_ffffffffffffc9c0);
                sprintf(&stack0xffffffffffffc9c8,"%s",local_38);
                local_28 = local_8->in_room->exit[local_14];
                if (local_28 == (EXIT_DATA *)0x0) {
                  send_to_char((char *)in_stack_ffffffffffffc9d0,
                               (CHAR_DATA *)
                               CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
                }
                else {
                  bVar1 = is_npc(in_stack_ffffffffffffc9b8);
                  if ((bVar1) && (local_30->pIndexData->barred_entry != (BARRED_DATA *)0x0)) {
                    send_to_char((char *)in_stack_ffffffffffffc9d0,
                                 (CHAR_DATA *)
                                 CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
                  }
                  else {
                    bVar1 = check_barred((CHAR_DATA *)
                                         CONCAT17(in_stack_ffffffffffffc9df,
                                                  in_stack_ffffffffffffc9d8),
                                         (ROOM_INDEX_DATA *)in_stack_ffffffffffffc9d0);
                    if (!bVar1) {
                      bVar1 = check_barred((CHAR_DATA *)
                                           CONCAT17(in_stack_ffffffffffffc9df,
                                                    in_stack_ffffffffffffc9d8),
                                           (ROOM_INDEX_DATA *)in_stack_ffffffffffffc9d0);
                      if (bVar1) {
                        send_to_char((char *)in_stack_ffffffffffffc9d0,
                                     (CHAR_DATA *)
                                     CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
                      }
                      else {
                        bVar1 = is_npc(in_stack_ffffffffffffc9b8);
                        if (((!bVar1) && (bVar1 = is_npc(in_stack_ffffffffffffc9b8), !bVar1)) &&
                           ((local_8->fighting == (CHAR_DATA *)0x0 ||
                            (local_30->fighting == (CHAR_DATA *)0x0)))) {
                          in_stack_ffffffffffffc9b8 = local_1238;
                          pcVar3 = pers((CHAR_DATA *)
                                        CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8
                                                ),in_stack_ffffffffffffc9c0);
                          sprintf((char *)in_stack_ffffffffffffc9b8,
                                  "Help! %s is dragging me around!",pcVar3);
                          do_myell(in_stack_ffffffffffffc9d0,
                                   (char *)CONCAT44(in_stack_ffffffffffffc9cc,
                                                    in_stack_ffffffffffffc9c8),
                                   in_stack_ffffffffffffc9c0);
                        }
                        local_18 = local_18 + ((int)local_30->size - (int)local_8->size) * -0xf;
                        iVar2 = number_percent();
                        if (iVar2 < local_18) {
                          act((char *)in_stack_ffffffffffffc9d0,
                              (CHAR_DATA *)
                              CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8),
                              in_stack_ffffffffffffc9c0,in_stack_ffffffffffffc9b8,0);
                          act((char *)in_stack_ffffffffffffc9d0,
                              (CHAR_DATA *)
                              CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8),
                              in_stack_ffffffffffffc9c0,in_stack_ffffffffffffc9b8,0);
                          local_20 = local_28->u1;
                          move_char(in_stack_ffffffffffffe0e0,in_stack_ffffffffffffe0dc,
                                    (bool)in_stack_ffffffffffffe0db,(bool)in_stack_ffffffffffffe0da)
                          ;
                          char_from_room(in_stack_ffffffffffffca10);
                          char_to_room(in_stack_ffffffffffffc9f0,
                                       (ROOM_INDEX_DATA *)in_stack_ffffffffffffc9e8);
                          do_look((CHAR_DATA *)store._520_8_,(char *)store._512_8_);
                          if (local_30->in_room != local_8->in_room) {
                            return;
                          }
                          act((char *)in_stack_ffffffffffffc9d0,
                              (CHAR_DATA *)
                              CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8),
                              in_stack_ffffffffffffc9c0,in_stack_ffffffffffffc9b8,0);
                          check_improve(in_stack_ffffffffffffcaa0,in_stack_ffffffffffffca9c,
                                        (bool)in_stack_ffffffffffffca9b,in_stack_ffffffffffffca94);
                        }
                        else {
                          act((char *)in_stack_ffffffffffffc9d0,
                              (CHAR_DATA *)
                              CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8),
                              in_stack_ffffffffffffc9c0,in_stack_ffffffffffffc9b8,0);
                          act((char *)in_stack_ffffffffffffc9d0,
                              (CHAR_DATA *)
                              CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8),
                              in_stack_ffffffffffffc9c0,in_stack_ffffffffffffc9b8,0);
                          check_improve(in_stack_ffffffffffffcaa0,in_stack_ffffffffffffca9c,
                                        (bool)in_stack_ffffffffffffca9b,in_stack_ffffffffffffca94);
                        }
                        WAIT_STATE(in_stack_ffffffffffffc9d0,in_stack_ffffffffffffc9cc);
                      }
                    }
                  }
                }
              }
            }
            else {
              send_to_char((char *)in_stack_ffffffffffffc9d0,
                           (CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffc9cc,in_stack_ffffffffffffc9c8));
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void do_drag(CHAR_DATA *ch, char *argument)
{
	int where, skill;
	ROOM_INDEX_DATA *to_room;
	EXIT_DATA *pexit;
	CHAR_DATA *victim = nullptr;
	char *direction;
	char store[MSL], target[MSL], dir[MSL];

	/* Must have the skill to use it */
	skill = get_skill(ch, gsn_drag);

	if (skill == 0)
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	/* break up the argument into two variables */
	if (!*argument)
	{
		send_to_char("Who are you trying to drag where?\n\r", ch);
		return;
	}

	argument = one_argument(argument, target);
	argument = one_argument(argument, dir);

	if (!*target)
	{
		send_to_char("Who are you trying to drag?\n\r", ch);
		return;
	}

	if (!*dir)
	{
		send_to_char("Where are you trying to drag them?\n\r", ch);
		return;
	}

	/* Set victim */
	victim = get_char_room(ch, target);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	/* Check for pk range */
	if (is_safe_new(ch, victim, true))
		return;

	if (is_awake(victim))
	{
		send_to_char("You can only drag unconscious people around.\n\r", ch);
		return;
	}

	if (is_npc(victim) && IS_SET(victim->act, ACT_SENTINEL))
	{
		act("You can't seem to move $N from $S position!", ch, 0, victim, TO_CHAR);
		return;
	}

	if (victim->size > (ch->size + 1))
	{
		/* Can't push yourself */
		if (victim == ch)
		{
			send_to_char("You can't drag yourself.\n\r", ch);
			return;
		}
	}

	if (ch->fighting)
	{
		send_to_char("You can't drag anyone while you are fighting!\n\r", ch);
		return;
	}

	/* Check to see if the direction verb is valid */
	where = direction_lookup(dir);

	if (where == -1)
	{
		send_to_char("That is not a direction!\n\r", ch);
		return;
	}

	/* Get the default word for the direction */
	direction = flag_name_lookup(where, direction_table);
	sprintf(dir, "%s", direction);

	/* Make sure the exit is valid */
	pexit = ch->in_room->exit[where];

	if (pexit == nullptr)
	{
		send_to_char("You cannot drag anyone that direction.\n\r", ch);
		return;
	}

	if (is_npc(victim) && victim->pIndexData->barred_entry)
	{
		send_to_char("They are too firmly in place to drag around.\n\r", ch);
		return;
	}

	if (check_barred(ch, pexit->u1.to_room))
		return;

	if (check_barred(ch, pexit->u1.to_room))
	{
		send_to_char("You were unable to drag them away.\n\r", ch);
		return;
	}

	if (!is_npc(ch) && !is_npc(victim) && (ch->fighting == nullptr || victim->fighting == nullptr))
	{
		sprintf(store, "Help! %s is dragging me around!", pers(ch, victim));
		do_myell(victim, store, ch);
	}

	skill -= (victim->size - ch->size) * 15;

	if (number_percent() < skill)
	{
		act("You grapple $N, and try to drag $M to the $t!", ch, dir, victim, TO_CHAR);
		act("$n grapples $N, and tries to drag $M to the $t!", ch, dir, victim, TO_NOTVICT);

		to_room = pexit->u1.to_room;

		move_char(ch, where, true, false);

		char_from_room(victim);
		char_to_room(victim, to_room);

		do_look(victim, "auto");

		if (victim->in_room != ch->in_room)
			return;

		act("$n drags $N in from the $t!", ch, dir, victim, TO_NOTVICT);
		check_improve(ch, gsn_drag, true, 1);
	}
	else
	{
		act("You grapple $N, and try to drag $M but $E doesn't budge!", ch, 0, victim, TO_CHAR);
		act("$n grapples $N, and tries to drag $M away but $N doesn't budge!", ch, 0, victim, TO_NOTVICT);
		check_improve(ch, gsn_drag, false, 1);
	}

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}